

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O0

void __thiscall ipx::KKTSolverBasis::_Factorize(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  bool bVar1;
  Int IVar2;
  Int IVar3;
  ipxint iVar4;
  double *pdVar5;
  long in_RDX;
  long in_RDI;
  double dVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  Maxvolume maxvol;
  Int j;
  Int n;
  Int m;
  Basis *in_stack_000000a0;
  double *in_stack_000000d0;
  Basis *in_stack_000000d8;
  SplittedNormalMatrix *in_stack_000000e0;
  Basis *in_stack_00000110;
  double *in_stack_00000118;
  Maxvolume *in_stack_00000120;
  Basis *in_stack_00000150;
  double *in_stack_00000158;
  Maxvolume *in_stack_00000160;
  Info *in_stack_00000170;
  Iterate *in_stack_00000178;
  KKTSolverBasis *in_stack_00000180;
  Info *in_stack_000001e0;
  Iterate *in_stack_000001e8;
  KKTSolverBasis *in_stack_000001f0;
  Iterate *in_stack_ffffffffffffff70;
  Int in_stack_ffffffffffffffa4;
  Iterate *in_stack_ffffffffffffffa8;
  int local_24;
  
  IVar2 = Model::rows(*(Model **)(in_RDI + 0x10));
  IVar3 = Model::cols(*(Model **)(in_RDI + 0x10));
  *(undefined4 *)(in_RDX + 0xc) = 0;
  *(undefined1 *)(in_RDI + 0x238) = 0;
  *(undefined4 *)(in_RDI + 0x240) = 0;
  *(undefined4 *)(in_RDI + 0x244) = 0;
  for (local_24 = 0; local_24 < IVar3 + IVar2; local_24 = local_24 + 1) {
    dVar6 = Iterate::ScalingFactor(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x228),(long)local_24);
    *pdVar5 = dVar6;
  }
  dVar6 = Iterate::pobjective(in_stack_ffffffffffffff70);
  dVar7 = Iterate::dobjective(in_stack_ffffffffffffff70);
  if ((dVar6 < dVar7) ||
     ((DropPrimal(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0),
      *(int *)(in_RDX + 0xc) == 0 &&
      (DropDual(in_stack_00000180,in_stack_00000178,in_stack_00000170), *(int *)(in_RDX + 0xc) == 0)
      ))) {
    Maxvolume::Maxvolume((Maxvolume *)&stack0xffffffffffffff98,*(Control **)(in_RDI + 8));
    iVar4 = Control::update_heuristic(*(Control **)(in_RDI + 8));
    if (iVar4 == 0) {
      pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x228),0);
      IVar2 = Maxvolume::RunSequential(in_stack_00000120,in_stack_00000118,in_stack_00000110);
      *(Int *)(in_RDX + 0xc) = IVar2;
    }
    else {
      pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x228),0);
      IVar2 = Maxvolume::RunHeuristic(in_stack_00000160,in_stack_00000158,in_stack_00000150);
      *(Int *)(in_RDX + 0xc) = IVar2;
    }
    IVar2 = Maxvolume::updates((Maxvolume *)&stack0xffffffffffffff98);
    *(Int *)(in_RDX + 0xd4) = IVar2 + *(int *)(in_RDX + 0xd4);
    Maxvolume::time((Maxvolume *)&stack0xffffffffffffff98,(time_t *)pdVar5);
    *(double *)(in_RDX + 0x118) = extraout_XMM0_Qa + *(double *)(in_RDX + 0x118);
    IVar2 = Maxvolume::updates((Maxvolume *)&stack0xffffffffffffff98);
    *(Int *)(in_RDI + 0x244) = IVar2 + *(int *)(in_RDI + 0x244);
    if (*(int *)(in_RDX + 0xc) == 0) {
      bVar1 = Basis::FactorizationIsFresh(*(Basis **)(in_RDI + 0x18));
      if (!bVar1) {
        IVar2 = Basis::Factorize(in_stack_000000a0);
        *(Int *)(in_RDX + 0xc) = IVar2;
        if (*(int *)(in_RDX + 0xc) != 0) {
          return;
        }
      }
      std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x228),0);
      SplittedNormalMatrix::Prepare(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
      *(undefined1 *)(in_RDI + 0x238) = 1;
    }
  }
  return;
}

Assistant:

void KKTSolverBasis::_Factorize(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    info->errflag = 0;
    factorized_ = false;
    iter_ = 0;
    basis_changes_ = 0;

    for (Int j = 0; j < n+m; j++)
        colscale_[j] = iterate->ScalingFactor(j);

    // Remove degenerate variables unless the primal objective is smaller than
    // the dual objective. In the latter case the model might be infeasible or
    // unbounded. In order not to affect an infeasibility test in the IPM (not
    // yet implemented) we do not remove variables if the model looks
    // infeasible.
    if (iterate->pobjective() >= iterate->dobjective()) {
        DropPrimal(iterate, info);
        if (info->errflag)
            return;
        DropDual(iterate, info);
        if (info->errflag)
            return;
    }

    // Run maxvolume ("Russian algorithm").
    Maxvolume maxvol(control_);
    if (control_.update_heuristic() == 0) {
        info->errflag = maxvol.RunSequential(&colscale_[0], basis_);
    } else {
        info->errflag = maxvol.RunHeuristic(&colscale_[0], basis_);
    }
    info->updates_ipm += maxvol.updates();
    info->time_maxvol += maxvol.time();
    basis_changes_ += maxvol.updates();
    if (info->errflag)
        return;

    // Refactorize and build preconditioned normal matrix.
    if (!basis_.FactorizationIsFresh()) {
        info->errflag = basis_.Factorize();
        if (info->errflag)
            return;
    }
    splitted_normal_matrix_.Prepare(basis_, &colscale_[0]);

    factorized_ = true;
}